

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_ClassId * __thiscall ON_OBSOLETE_V5_DimExtra::ClassId(ON_OBSOLETE_V5_DimExtra *this)

{
  return &m_ON_OBSOLETE_V5_DimExtra_class_rtti;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}